

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool,false,false>
               (date_t *ldata,interval_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  undefined4 left;
  undefined4 left_00;
  undefined4 left_01;
  unsigned_long *puVar1;
  timestamp_t tVar2;
  timestamp_t *ptVar3;
  timestamp_t *ptVar4;
  idx_t iVar5;
  ulong uVar6;
  int64_t *piVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      piVar7 = &rdata->micros;
      iVar8 = 0;
      iVar5 = count;
      do {
        left_01 = ((interval_t *)(piVar7 + -1))->months;
        right_01.micros = iVar5;
        right_01._0_8_ = *piVar7;
        tVar2 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                          ((AddOperator *)(ulong)(uint)ldata[iVar8].days,(date_t)left_01,right_01);
        result_data[iVar8].value = tVar2.value;
        iVar8 = iVar8 + 1;
        piVar7 = piVar7 + 2;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    ptVar3 = (timestamp_t *)0x0;
    uVar10 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar1[(long)ptVar3];
      }
      uVar9 = uVar10 + 0x40;
      if (count <= uVar10 + 0x40) {
        uVar9 = count;
      }
      uVar11 = uVar9;
      if (uVar6 != 0) {
        uVar11 = uVar10;
        if (uVar6 == 0xffffffffffffffff) {
          if (uVar10 < uVar9) {
            piVar7 = &rdata[uVar10].micros;
            ptVar4 = ptVar3;
            do {
              left = ((interval_t *)(piVar7 + -1))->months;
              right.micros = (int64_t)ptVar4;
              right._0_8_ = *piVar7;
              tVar2 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                ((AddOperator *)(ulong)(uint)ldata[uVar10].days,(date_t)left,right);
              result_data[uVar10].value = tVar2.value;
              uVar10 = uVar10 + 1;
              piVar7 = piVar7 + 2;
              uVar11 = uVar10;
            } while (uVar9 != uVar10);
          }
        }
        else if (uVar10 < uVar9) {
          piVar7 = &rdata[uVar10].micros;
          uVar11 = 0;
          ptVar4 = ptVar3;
          do {
            if ((uVar6 >> (uVar11 & 0x3f) & 1) != 0) {
              left_00 = ((interval_t *)(piVar7 + -1))->months;
              right_00.micros = (int64_t)ptVar4;
              right_00._0_8_ = *piVar7;
              tVar2 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                                ((AddOperator *)(ulong)(uint)ldata[uVar10 + uVar11].days,
                                 (date_t)left_00,right_00);
              (result_data + uVar10)[uVar11].value = tVar2.value;
              ptVar4 = result_data + uVar10;
            }
            uVar11 = uVar11 + 1;
            piVar7 = piVar7 + 2;
          } while ((uVar10 - uVar9) + uVar11 != 0);
          uVar11 = uVar10 + uVar11;
        }
      }
      ptVar3 = (timestamp_t *)((long)&ptVar3->value + 1);
      uVar10 = uVar11;
    } while (ptVar3 != (timestamp_t *)(count + 0x3f >> 6));
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}